

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

void google::protobuf::internal::SerializeMapEntry
               (FieldDescriptor *field,MapKey *key,MapValueRef *value,CodedOutputStream *output)

{
  int field_number;
  Descriptor *pDVar1;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  size_t sVar2;
  size_t sVar3;
  size_t size;
  FieldDescriptor *value_field;
  FieldDescriptor *key_field;
  CodedOutputStream *output_local;
  MapValueRef *value_local;
  MapKey *key_local;
  FieldDescriptor *field_local;
  
  pDVar1 = FieldDescriptor::message_type(field);
  field_00 = Descriptor::field(pDVar1,0);
  pDVar1 = FieldDescriptor::message_type(field);
  field_01 = Descriptor::field(pDVar1,1);
  field_number = FieldDescriptor::number(field);
  WireFormatLite::WriteTag(field_number,WIRETYPE_LENGTH_DELIMITED,output);
  sVar2 = MapKeyDataOnlyByteSize(field_00,key);
  sVar3 = MapValueRefDataOnlyByteSize(field_01,value);
  io::CodedOutputStream::WriteVarint32(output,(int)sVar3 + (int)sVar2 + 2);
  SerializeMapKeyWithCachedSizes(field_00,key,output);
  SerializeMapValueRefWithCachedSizes(field_01,value,output);
  return;
}

Assistant:

static void SerializeMapEntry(const FieldDescriptor* field, const MapKey& key,
                              const MapValueRef& value,
                              io::CodedOutputStream* output) {
  const FieldDescriptor* key_field = field->message_type()->field(0);
  const FieldDescriptor* value_field = field->message_type()->field(1);

  WireFormatLite::WriteTag(field->number(),
                           WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
  size_t size = kMapEntryTagByteSize;
  size += MapKeyDataOnlyByteSize(key_field, key);
  size += MapValueRefDataOnlyByteSize(value_field, value);
  output->WriteVarint32(size);
  SerializeMapKeyWithCachedSizes(key_field, key, output);
  SerializeMapValueRefWithCachedSizes(value_field, value, output);
}